

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRefMB *pPVar2;
  Vec3fx *pVVar3;
  BBox1f BVar4;
  char *pcVar5;
  PrimRefMB *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  LBBox3fx *pLVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  size_t sVar17;
  size_t *psVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined4 uVar22;
  long lVar23;
  uint uVar24;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float local_218;
  float local_214;
  ulong local_1e0;
  size_t local_1c0;
  unsigned_long local_1b8;
  size_t local_1b0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  BBox1f local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_100;
  anon_class_16_2_07cfa4d6 local_f8;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BufferView<embree::Vec3fx> *pBVar25;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar16 = r->_begin;
  local_158.lower = 0.0;
  local_158.upper = 1.0;
  local_1b8 = 0;
  local_218 = 0.0;
  local_214 = 1.0;
  local_168._8_8_ = 0xff800000ff800000;
  local_168._0_8_ = 0xff800000ff800000;
  local_1e0 = 0;
  local_1c0 = 0;
  local_178._8_8_ = 0x7f8000007f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_138._8_8_ = 0xff800000ff800000;
  local_138._0_8_ = 0xff800000ff800000;
  local_188._8_8_ = 0xff800000ff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_148._8_8_ = 0x7f8000007f800000;
  local_148._0_8_ = 0x7f8000007f800000;
  local_198._8_8_ = 0x7f8000007f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  local_1b0 = k;
  while( true ) {
    if (r->_end <= uVar16) {
      (__return_storage_ptr__->object_range)._end = local_1b8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_198._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_198._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_148._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_148._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_138._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_138._8_8_;
      (__return_storage_ptr__->time_range).lower = local_214;
      (__return_storage_ptr__->time_range).upper = local_218;
      __return_storage_ptr__->num_time_segments = local_1c0;
      __return_storage_ptr__->max_num_time_segments = local_1e0;
      __return_storage_ptr__->max_time_range = local_158;
      return __return_storage_ptr__;
    }
    BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    fVar39 = BVar4.lower;
    fVar46 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.fnumTimeSegments;
    fVar30 = t0t1->lower;
    fVar31 = t0t1->upper;
    fVar41 = BVar4.upper - fVar39;
    fVar27 = ceilf(((fVar31 - fVar39) / fVar41) * 0.99999976 * fVar46);
    uVar42 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.field_0x68 * uVar16);
    pBVar25 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              vertices.items;
    if ((ulong)(uVar42 + 3) < (pBVar25->super_RawBufferView).num) break;
LAB_0023f152:
    uVar16 = uVar16 + 1;
  }
  if (fVar46 <= fVar27) {
    fVar27 = fVar46;
  }
  fVar28 = (fVar30 - fVar39) / fVar41;
  fVar29 = floorf(fVar28 * 1.0000002 * fVar46);
  fVar30 = 0.0;
  if (0.0 <= fVar29) {
    fVar30 = fVar29;
  }
  psVar18 = &pBVar25[(int)fVar30].super_RawBufferView.stride;
  uVar13 = (long)(int)fVar30 - 1;
LAB_0023f059:
  uVar13 = uVar13 + 1;
  if ((ulong)(long)(int)fVar27 < uVar13) {
    local_f8.primID = &local_100;
    fVar41 = (fVar31 - fVar39) / fVar41;
    fVar27 = fVar46 * fVar41;
    local_100 = uVar16;
    local_f8.this = this;
    fVar30 = floorf(fVar46 * fVar28);
    fVar31 = ceilf(fVar27);
    iVar14 = (int)fVar30;
    if (fVar30 <= 0.0) {
      fVar30 = 0.0;
    }
    fVar39 = fVar31;
    if (fVar46 <= fVar31) {
      fVar39 = fVar46;
    }
    iVar15 = -1;
    if (-1 < iVar14) {
      iVar15 = iVar14;
    }
    iVar11 = (int)fVar46 + 1;
    if ((int)fVar31 < (int)fVar46 + 1) {
      iVar11 = (int)fVar31;
    }
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_f8,(long)(int)fVar30);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_f8,(long)(int)fVar39);
    fVar31 = fVar46 * fVar28 - fVar30;
    if (iVar11 - iVar15 == 1) {
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      fVar46 = 1.0 - fVar31;
      fVar49 = fVar46 * blower0.lower.field_0.m128[0] + fVar31 * bupper1.lower.field_0.m128[0];
      fVar50 = fVar46 * blower0.lower.field_0.m128[1] + fVar31 * bupper1.lower.field_0.m128[1];
      fVar51 = fVar46 * blower0.lower.field_0.m128[2] + fVar31 * bupper1.lower.field_0.m128[2];
      fVar30 = fVar46 * blower0.upper.field_0.m128[0] + fVar31 * bupper1.upper.field_0.m128[0];
      fVar47 = fVar46 * blower0.upper.field_0.m128[1] + fVar31 * bupper1.upper.field_0.m128[1];
      fVar48 = fVar46 * blower0.upper.field_0.m128[2] + fVar31 * bupper1.upper.field_0.m128[2];
      fVar39 = fVar39 - fVar27;
      if (fVar39 <= 0.0) {
        fVar39 = 0.0;
      }
      fVar46 = 1.0 - fVar39;
      fVar53 = bupper1.lower.field_0.m128[0] * fVar46 + blower0.lower.field_0.m128[0] * fVar39;
      fVar54 = bupper1.lower.field_0.m128[1] * fVar46 + blower0.lower.field_0.m128[1] * fVar39;
      fVar55 = bupper1.lower.field_0.m128[2] * fVar46 + blower0.lower.field_0.m128[2] * fVar39;
      fVar27 = fVar46 * bupper1.upper.field_0.m128[0] + fVar39 * blower0.upper.field_0.m128[0];
      fVar44 = fVar46 * bupper1.upper.field_0.m128[1] + fVar39 * blower0.upper.field_0.m128[1];
      fVar45 = fVar46 * bupper1.upper.field_0.m128[2] + fVar39 * blower0.upper.field_0.m128[2];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_f8,(long)((int)fVar30 + 1))
      ;
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_f8,(long)((int)fVar39 + -1));
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      fVar29 = 1.0 - fVar31;
      fVar49 = blower0.lower.field_0.m128[0] * fVar29 + blower1.lower.field_0.m128[0] * fVar31;
      fVar50 = blower0.lower.field_0.m128[1] * fVar29 + blower1.lower.field_0.m128[1] * fVar31;
      fVar51 = blower0.lower.field_0.m128[2] * fVar29 + blower1.lower.field_0.m128[2] * fVar31;
      fVar52 = blower0.lower.field_0.m128[3] * fVar29 + blower1.lower.field_0.m128[3] * fVar31;
      fVar30 = fVar29 * blower0.upper.field_0.m128[0] + fVar31 * blower1.upper.field_0.m128[0];
      fVar47 = fVar29 * blower0.upper.field_0.m128[1] + fVar31 * blower1.upper.field_0.m128[1];
      fVar48 = fVar29 * blower0.upper.field_0.m128[2] + fVar31 * blower1.upper.field_0.m128[2];
      fVar31 = fVar29 * blower0.upper.field_0.m128[3] + fVar31 * blower1.upper.field_0.m128[3];
      fVar39 = fVar39 - fVar27;
      if (fVar39 <= 0.0) {
        fVar39 = 0.0;
      }
      fVar29 = 1.0 - fVar39;
      fVar53 = bupper1.lower.field_0.m128[0] * fVar29 + bupper0.lower.field_0.m128[0] * fVar39;
      fVar54 = bupper1.lower.field_0.m128[1] * fVar29 + bupper0.lower.field_0.m128[1] * fVar39;
      fVar55 = bupper1.lower.field_0.m128[2] * fVar29 + bupper0.lower.field_0.m128[2] * fVar39;
      fVar56 = bupper1.lower.field_0.m128[3] * fVar29 + bupper0.lower.field_0.m128[3] * fVar39;
      fVar27 = fVar29 * bupper1.upper.field_0.m128[0] + fVar39 * bupper0.upper.field_0.m128[0];
      fVar44 = fVar29 * bupper1.upper.field_0.m128[1] + fVar39 * bupper0.upper.field_0.m128[1];
      fVar45 = fVar29 * bupper1.upper.field_0.m128[2] + fVar39 * bupper0.upper.field_0.m128[2];
      fVar39 = fVar29 * bupper1.upper.field_0.m128[3] + fVar39 * bupper0.upper.field_0.m128[3];
      if (iVar14 < 0) {
        iVar14 = -1;
      }
      sVar17 = (size_t)iVar14;
      while (sVar17 = sVar17 + 1, (long)sVar17 < (long)iVar11) {
        fVar29 = ((float)(int)sVar17 / fVar46 - fVar28) / (fVar41 - fVar28);
        fVar43 = 1.0 - fVar29;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_f8,sVar17);
        auVar38._0_4_ = bi.lower.field_0.m128[0] - (fVar49 * fVar43 + fVar53 * fVar29);
        auVar38._4_4_ = bi.lower.field_0.m128[1] - (fVar50 * fVar43 + fVar54 * fVar29);
        auVar38._8_4_ = bi.lower.field_0.m128[2] - (fVar51 * fVar43 + fVar55 * fVar29);
        auVar38._12_4_ = bi.lower.field_0.m128[3] - (fVar52 * fVar43 + fVar56 * fVar29);
        auVar40._0_4_ = bi.upper.field_0.m128[0] - (fVar43 * fVar30 + fVar29 * fVar27);
        auVar40._4_4_ = bi.upper.field_0.m128[1] - (fVar43 * fVar47 + fVar29 * fVar44);
        auVar40._8_4_ = bi.upper.field_0.m128[2] - (fVar43 * fVar48 + fVar29 * fVar45);
        auVar40._12_4_ = bi.upper.field_0.m128[3] - (fVar43 * fVar31 + fVar29 * fVar39);
        auVar38 = minps(auVar38,ZEXT816(0));
        auVar40 = maxps(auVar40,ZEXT816(0));
        fVar49 = fVar49 + auVar38._0_4_;
        fVar50 = fVar50 + auVar38._4_4_;
        fVar51 = fVar51 + auVar38._8_4_;
        fVar52 = fVar52 + auVar38._12_4_;
        fVar53 = fVar53 + auVar38._0_4_;
        fVar54 = fVar54 + auVar38._4_4_;
        fVar55 = fVar55 + auVar38._8_4_;
        fVar56 = fVar56 + auVar38._12_4_;
        fVar30 = fVar30 + auVar40._0_4_;
        fVar47 = fVar47 + auVar40._4_4_;
        fVar48 = fVar48 + auVar40._8_4_;
        fVar31 = fVar31 + auVar40._12_4_;
        fVar27 = fVar27 + auVar40._0_4_;
        fVar44 = fVar44 + auVar40._4_4_;
        fVar45 = fVar45 + auVar40._8_4_;
        fVar39 = fVar39 + auVar40._12_4_;
      }
    }
    fVar46 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.super_Geometry.numTimeSteps - 1);
    uVar13 = (ulong)(uint)fVar46;
    fVar31 = (float)uVar16;
    auVar37._0_4_ = fVar30 * 0.5 + fVar27 * 0.5 + fVar49 * 0.5 + fVar53 * 0.5;
    auVar37._4_4_ = fVar47 * 0.5 + fVar44 * 0.5 + fVar50 * 0.5 + fVar54 * 0.5;
    auVar37._8_4_ = fVar48 * 0.5 + fVar45 * 0.5 + fVar51 * 0.5 + fVar55 * 0.5;
    auVar37._12_4_ = fVar31 * 0.5 + fVar46 * 0.5 + (float)geomID * 0.5 + fVar46 * 0.5;
    BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar9._4_4_ = fVar50;
    auVar9._0_4_ = fVar49;
    auVar9._8_4_ = fVar51;
    auVar9._12_4_ = geomID;
    local_198 = minps(local_198,auVar9);
    local_1b8 = local_1b8 + 1;
    local_1c0 = local_1c0 + uVar13;
    bVar26 = local_1e0 < uVar13;
    if (local_1e0 <= uVar13) {
      local_1e0 = uVar13;
    }
    pPVar6 = prims->items;
    pPVar2 = pPVar6 + local_1b0;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[0] = fVar49;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[1] = fVar50;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[2] = fVar51;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
    auVar8._4_4_ = fVar47;
    auVar8._0_4_ = fVar30;
    auVar8._8_4_ = fVar48;
    auVar8._12_4_ = fVar31;
    local_188 = maxps(local_188,auVar8);
    pVVar3 = &pPVar6[local_1b0].lbounds.bounds0.upper;
    (pVVar3->field_0).m128[0] = fVar30;
    (pVVar3->field_0).m128[1] = fVar47;
    (pVVar3->field_0).m128[2] = fVar48;
    (pVVar3->field_0).m128[3] = fVar31;
    auVar10._4_4_ = fVar54;
    auVar10._0_4_ = fVar53;
    auVar10._8_4_ = fVar55;
    auVar10._12_4_ = fVar46;
    local_178 = minps(local_178,auVar10);
    pLVar12 = &pPVar6[local_1b0].lbounds;
    (pLVar12->bounds1).lower.field_0.m128[0] = fVar53;
    (pLVar12->bounds1).lower.field_0.m128[1] = fVar54;
    (pLVar12->bounds1).lower.field_0.m128[2] = fVar55;
    (pLVar12->bounds1).lower.field_0.m128[3] = fVar46;
    auVar7._4_4_ = fVar44;
    auVar7._0_4_ = fVar27;
    auVar7._8_4_ = fVar45;
    auVar7._12_4_ = fVar46;
    local_168 = maxps(local_168,auVar7);
    pVVar3 = &pPVar6[local_1b0].lbounds.bounds1.upper;
    (pVVar3->field_0).m128[0] = fVar27;
    (pVVar3->field_0).m128[1] = fVar44;
    (pVVar3->field_0).m128[2] = fVar45;
    (pVVar3->field_0).m128[3] = fVar46;
    pPVar6[local_1b0].time_range = BVar4;
    local_148 = minps(local_148,auVar37);
    local_138 = maxps(local_138,auVar37);
    fVar46 = BVar4.lower;
    if (fVar46 <= local_214) {
      local_214 = fVar46;
    }
    fVar31 = BVar4.upper;
    fVar30 = fVar31;
    if (fVar31 <= local_218) {
      fVar30 = local_218;
    }
    uVar42 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
    uVar24 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
    local_1b0 = local_1b0 + 1;
    local_158.upper = (float)(~uVar24 & (uint)local_158.upper | (uint)fVar31 & uVar24);
    local_158.lower = (float)(~uVar42 & (uint)local_158.lower | (uint)fVar46 & uVar42);
    local_218 = fVar30;
  }
  else {
    pcVar5 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
    sVar17 = *psVar18;
    lVar23 = sVar17 * uVar42;
    lVar21 = sVar17 * (uVar42 + 1);
    lVar20 = sVar17 * (uVar42 + 2);
    lVar19 = sVar17 * (uVar42 + 3);
    auVar32._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar21 + 0xc)));
    auVar32._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar23 + 0xc)));
    auVar32._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar20 + 0xc)));
    auVar32._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar19 + 0xc)));
    uVar24 = movmskps((int)pBVar25,auVar32);
    pBVar25 = (BufferView<embree::Vec3fx> *)(ulong)uVar24;
    if (uVar24 == 0) {
      pfVar1 = (float *)(pcVar5 + lVar23);
      auVar33._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
      auVar33._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
      auVar33._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
      auVar33._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
      uVar22 = movmskps((int)lVar23,auVar33);
      if ((~(byte)uVar22 & 7) == 0) {
        pfVar1 = (float *)(pcVar5 + lVar21);
        auVar34._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar34._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar34._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar34._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar22 = movmskps((int)lVar21,auVar34);
        if ((~(byte)uVar22 & 7) == 0) {
          pfVar1 = (float *)(pcVar5 + lVar20);
          auVar35._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
          auVar35._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
          auVar35._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
          auVar35._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
          uVar22 = movmskps((int)lVar20,auVar35);
          if ((~(byte)uVar22 & 7) == 0) goto code_r0x0023f11e;
        }
      }
    }
  }
  goto LAB_0023f152;
code_r0x0023f11e:
  psVar18 = psVar18 + 7;
  pfVar1 = (float *)(pcVar5 + lVar19);
  auVar36._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
  auVar36._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
  auVar36._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
  auVar36._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
  uVar22 = movmskps((int)pcVar5,auVar36);
  if ((~(byte)uVar22 & 7) != 0) goto LAB_0023f152;
  goto LAB_0023f059;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }